

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffhdr2str(fitsfile *fptr,int exclude_comm,char **exclist,int nexc,char **header,int *nkeys,
             int *status)

{
  bool bVar1;
  char **ppcVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  int totkeys;
  int match;
  int exact;
  char keyname [75];
  char keybuf [162];
  int local_164;
  char *local_160;
  int local_154;
  int local_150;
  int local_14c;
  int *local_148;
  char **local_140;
  fitsfile *local_138;
  int local_12c;
  char local_128;
  undefined7 uStack_127;
  char local_120;
  char local_d8 [168];
  
  *nkeys = 0;
  iVar3 = *status;
  if (iVar3 < 1) {
    local_150 = exclude_comm;
    iVar3 = ffghsp(fptr,&local_164,(int *)0x0,status);
    if (iVar3 < 1) {
      local_138 = fptr;
      local_160 = (char *)calloc((long)(local_164 * 0x50 + 0x51),1);
      *header = local_160;
      if (local_160 == (char *)0x0) {
        *status = 0x71;
        ffpmsg("failed to allocate memory to hold all the header keywords");
      }
      else {
        local_148 = nkeys;
        local_140 = header;
        if (0 < local_164) {
          lVar7 = 1;
          local_154 = nexc;
          do {
            ffgrec(local_138,(int)lVar7,local_d8,status);
            sVar4 = strlen(local_d8);
            memcpy(local_d8 + sVar4,
                   "                                                                                "
                   ,0x51);
            local_128 = '\0';
            strncat(&local_128,local_d8,8);
            if (local_150 == 0) {
LAB_0016c700:
              if (local_154 < 1) {
                lVar6 = 0;
              }
              else {
                lVar6 = 0;
                do {
                  ffcmps(exclist[lVar6],&local_128,0,&local_14c,&local_12c);
                  if (local_14c != 0) break;
                  lVar6 = lVar6 + 1;
                } while (nexc != lVar6);
              }
              pcVar5 = local_160;
              if (lVar6 == nexc) {
                strcpy(local_160,local_d8);
                local_160 = pcVar5 + 0x50;
                *local_148 = *local_148 + 1;
              }
            }
            else {
              if (local_128 == ' ') {
                if (local_120 == '\0' && CONCAT71(uStack_127,0x20) == 0x2020202020202020)
                goto LAB_0016c764;
                goto LAB_0016c700;
              }
              if (local_128 == 'H') {
                if (local_120 != '\0' || CONCAT71(uStack_127,0x48) != 0x2059524f54534948)
                goto LAB_0016c700;
              }
              else if ((local_128 != 'C') ||
                      (local_120 != '\0' || CONCAT71(uStack_127,0x43) != 0x20544e454d4d4f43))
              goto LAB_0016c700;
            }
LAB_0016c764:
            bVar1 = lVar7 < local_164;
            lVar7 = lVar7 + 1;
          } while (bVar1);
        }
        pcVar5 = local_160;
        memcpy(local_160,
               "END                                                                             ",
               0x51);
        ppcVar2 = local_140;
        *local_148 = *local_148 + 1;
        pcVar5[0x50] = '\0';
        pcVar5 = (char *)realloc(*local_140,(long)*local_148 * 0x50 + 1);
        *ppcVar2 = pcVar5;
      }
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffhdr2str( fitsfile *fptr,  /* I - FITS file pointer                    */
            int exclude_comm,   /* I - if TRUE, exclude commentary keywords */
            char **exclist,     /* I - list of excluded keyword names       */
            int nexc,           /* I - number of names in exclist           */
            char **header,      /* O - returned header string               */
            int *nkeys,         /* O - returned number of 80-char keywords  */
            int  *status)       /* IO - error status                        */
/*
  read header keywords into a long string of chars.  This routine allocates
  memory for the string, so the calling routine must eventually free the
  memory when it is not needed any more.  If exclude_comm is TRUE, then all 
  the COMMENT, HISTORY, and <blank> keywords will be excluded from the output
  string of keywords.  Any other list of keywords to be excluded may be
  specified with the exclist parameter.
*/
{
    int casesn, match, exact, totkeys;
    long ii, jj;
    char keybuf[162], keyname[FLEN_KEYWORD], *headptr;

    *nkeys = 0;

    if (*status > 0)
        return(*status);

    /* get number of keywords in the header (doesn't include END) */
    if (ffghsp(fptr, &totkeys, NULL, status) > 0)
        return(*status);

    /* allocate memory for all the keywords */
    /* (will reallocate it later to minimize the memory size) */
    
    *header = (char *) calloc ( (totkeys + 1) * 80 + 1, 1);
    if (!(*header))
    {
         *status = MEMORY_ALLOCATION;
         ffpmsg("failed to allocate memory to hold all the header keywords");
         return(*status);
    }

    headptr = *header;
    casesn = FALSE;

    /* read every keyword */
    for (ii = 1; ii <= totkeys; ii++) 
    {
        ffgrec(fptr, ii, keybuf, status);
        /* pad record with blanks so that it is at least 80 chars long */
        strcat(keybuf,
    "                                                                                ");

        keyname[0] = '\0';
        strncat(keyname, keybuf, 8); /* copy the keyword name */
        
        if (exclude_comm)
        {
            if (!FSTRCMP("COMMENT ", keyname) ||
                !FSTRCMP("HISTORY ", keyname) ||
                !FSTRCMP("        ", keyname) )
              continue;  /* skip this commentary keyword */
        }

        /* does keyword match any names in the exclusion list? */
        for (jj = 0; jj < nexc; jj++ )
        {
            ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                 if (match)
                     break;
        }

        if (jj == nexc)
        {
            /* not in exclusion list, add this keyword to the string */
            strcpy(headptr, keybuf);
            headptr += 80;
            (*nkeys)++;
        }
    }

    /* add the END keyword */
    strcpy(headptr,
    "END                                                                             ");
    headptr += 80;
    (*nkeys)++;

    *headptr = '\0';   /* terminate the header string */
    /* minimize the allocated memory */
    *header = (char *) realloc(*header, (*nkeys *80) + 1);  

    return(*status);
}